

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_socket.cpp
# Opt level: O0

void __thiscall async_reader::run(async_reader *this)

{
  mutable_buffer *pmVar1;
  long in_RDI;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  callback<void_(const_std::error_code_&,_unsigned_long)> *in_stack_ffffffffffffffc0;
  callback local_38 [8];
  async_reader in_stack_ffffffffffffffd0;
  
  pmVar1 = *(mutable_buffer **)(in_RDI + 8);
  booster::aio::buffer(in_stack_ffffffffffffff78);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::callback<async_reader>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd0);
  booster::aio::stream_socket::async_read_some(pmVar1,local_38);
  booster::callback<void_(const_std::error_code_&,_unsigned_long)>::~callback
            ((callback<void_(const_std::error_code_&,_unsigned_long)> *)0x121109);
  booster::aio::mutable_buffer::~mutable_buffer((mutable_buffer *)0x121113);
  return;
}

Assistant:

void run()
	{
		sock->async_read_some(io::buffer(*buf),*this);
	}